

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O3

void __thiscall transaction_tests::test_witness::test_method(test_witness *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  CTxIn *pCVar4;
  CMutableTransaction *pCVar5;
  pointer pCVar6;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar7;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator pvVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  iterator in_R9;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  span<const_std::byte,_18446744073709551615UL> b_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  CTransactionRef tx;
  CTransactionRef tx_00;
  CTransactionRef tx_01;
  CTransactionRef tx_02;
  CTransactionRef output2;
  CTransactionRef output1;
  vector<CPubKey,_std::allocator<CPubKey>_> oneandthree;
  CMutableTransaction input2;
  CMutableTransaction input1;
  CPubKey pubkey2L;
  CPubKey pubkey1L;
  CPubKey pubkey3;
  CPubKey pubkey2;
  CPubKey pubkey1;
  FillableSigningProvider keystore2;
  FillableSigningProvider keystore;
  undefined **ppuVar20;
  undefined1 local_ce8 [56];
  char *local_cb0;
  undefined1 local_ca8 [56];
  char *local_c70;
  undefined1 local_c68 [56];
  char *local_c30;
  undefined1 local_c28 [56];
  char *local_bf0;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_be8;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_bd8;
  char *local_bc8;
  char *local_bc0;
  undefined1 *local_bb8;
  undefined1 *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  char *local_b90;
  undefined1 *local_b88;
  undefined1 *local_b80;
  char *local_b78;
  char *local_b70;
  char *local_b68;
  char *local_b60;
  undefined1 *local_b58;
  undefined1 *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b38;
  char *local_b30;
  undefined1 *local_b28;
  undefined1 *local_b20;
  char *local_b18;
  char *local_b10;
  char *local_b08;
  char *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  undefined1 *local_ac8;
  undefined1 *local_ac0;
  char *local_ab8;
  char *local_ab0;
  char *local_aa8;
  char *local_aa0;
  undefined1 *local_a98;
  undefined1 *local_a90;
  char *local_a88;
  char *local_a80;
  char *local_a78;
  char *local_a70;
  undefined1 *local_a68;
  undefined1 *local_a60;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  undefined1 *local_a38;
  undefined1 *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  undefined1 *local_a08;
  undefined1 *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  char *local_9e0;
  undefined1 *local_9d8;
  undefined1 *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  undefined1 *local_9a8;
  undefined1 *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  undefined1 *local_978;
  undefined1 *local_970;
  char *local_968;
  char *local_960;
  vector<CPubKey,_std::allocator<CPubKey>_> local_958;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  undefined1 *local_890;
  char *local_888;
  char *local_880;
  undefined1 local_878 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_870;
  undefined1 local_868 [8];
  secure_unique_ptr<KeyType> local_860;
  undefined1 local_858 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_850;
  undefined1 local_848 [8];
  secure_unique_ptr<KeyType> local_840;
  undefined1 local_838 [8];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_830;
  undefined1 local_828 [72];
  direct_or_indirect local_7e0 [30];
  _func_int **local_490;
  char *pcStack_488;
  size_type local_480;
  undefined1 local_478 [28];
  uint local_45c;
  CMutableTransaction local_458;
  undefined1 local_420 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> vStack_408;
  direct_or_indirect local_3e8;
  uint uStack_3cc;
  direct_or_indirect local_3c8;
  uint uStack_3ac;
  direct_or_indirect local_3a8;
  uint uStack_38c;
  direct_or_indirect local_388;
  uint uStack_36c;
  direct_or_indirect local_368;
  uint uStack_34c;
  direct_or_indirect local_348;
  uint uStack_32c;
  undefined1 local_328 [28];
  uint uStack_30c;
  undefined1 local_308 [28];
  uint uStack_2ec;
  undefined1 local_2e8 [28];
  uint uStack_2cc;
  undefined1 local_2c8 [28];
  uint uStack_2ac;
  CPubKey local_29d;
  CPubKey local_25c;
  CPubKey local_21b;
  CPubKey local_1da;
  CPubKey local_199;
  undefined1 local_158 [144];
  undefined1 local_c8 [144];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8._32_8_ = local_c8 + 0x10;
  local_c8._0_8_ = &PTR__FillableSigningProvider_01399e20;
  local_c8._16_4_ = _S_red;
  local_c8._24_8_ = (_Base_ptr)0x0;
  local_c8._48_8_ = 0;
  local_c8._80_8_ = local_c8 + 0x40;
  local_c8._64_4_ = _S_red;
  local_c8._72_8_ = (_Base_ptr)0x0;
  local_c8._96_16_ = (undefined1  [16])0x0;
  local_c8._128_8_ = (__pthread_internal_list *)0x0;
  local_c8._136_8_ = (__pthread_internal_list *)0x0;
  local_c8._112_12_ = ZEXT412(1) << 0x40;
  local_c8._124_4_ = 0;
  local_158._32_8_ = local_158 + 0x10;
  ppuVar20 = &PTR__FillableSigningProvider_01399e20;
  local_158._0_8_ = &PTR__FillableSigningProvider_01399e20;
  local_158._16_4_ = _S_red;
  local_158._24_8_ = (_Base_ptr)0x0;
  local_158._48_8_ = 0;
  local_158._80_8_ = local_158 + 0x40;
  local_158._64_4_ = _S_red;
  local_158._72_8_ = (_Base_ptr)0x0;
  local_158._96_16_ = (undefined1  [16])0x0;
  local_158._128_8_ = (__pthread_internal_list *)0x0;
  local_158._136_8_ = (__pthread_internal_list *)0x0;
  local_158._112_12_ = ZEXT412(1) << 0x40;
  local_158._124_4_ = 0;
  local_158._40_8_ = local_158._32_8_;
  local_158._88_8_ = local_158._80_8_;
  local_c8._40_8_ = local_c8._32_8_;
  local_c8._88_8_ = local_c8._80_8_;
  GenerateRandomKey(SUB81((CKey *)local_838,0));
  GenerateRandomKey(SUB81(local_848,0));
  GenerateRandomKey(SUB81(local_858,0));
  GenerateRandomKey(SUB81(local_868,0));
  GenerateRandomKey(SUB81(local_878,0));
  CKey::GetPubKey(&local_199,(CKey *)local_838);
  CKey::GetPubKey(&local_1da,(CKey *)local_848);
  CKey::GetPubKey(&local_21b,(CKey *)local_858);
  CKey::GetPubKey(&local_25c,(CKey *)local_868);
  CKey::GetPubKey(&local_29d,(CKey *)local_878);
  local_888 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_880 = "";
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x269;
  file.m_begin = (iterator)&local_888;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_898,msg);
  local_420[0] = FillableSigningProvider::AddKeyPubKey
                           ((FillableSigningProvider *)local_c8,(CKey *)local_838,&local_199);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf2044c;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf20470;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_8a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_8a0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_8a8,0x269);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_8b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_8b0 = "";
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x26a;
  file_00.m_begin = (iterator)&local_8b8;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_8c8,
             msg_00);
  local_420[0] = FillableSigningProvider::AddKeyPubKey
                           ((FillableSigningProvider *)local_c8,(CKey *)local_848,&local_1da);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf20471;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf20495;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_8d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_8d0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_8d8,0x26a);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_8e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_8e0 = "";
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x26b;
  file_01.m_begin = (iterator)&local_8e8;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_8f8,
             msg_01);
  local_420[0] = FillableSigningProvider::AddKeyPubKey
                           ((FillableSigningProvider *)local_c8,(CKey *)local_868,&local_25c);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf20496;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf204bc;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_908 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_900 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_908,0x26b);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_918 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_910 = "";
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x26c;
  file_02.m_begin = (iterator)&local_918;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_928,
             msg_02);
  local_420[0] = FillableSigningProvider::AddKeyPubKey
                           ((FillableSigningProvider *)local_c8,(CKey *)local_878,&local_29d);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf204bd;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf204e3;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_938 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_930 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_938,0x26c);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  stack0xfffffffffffffd48 = (undefined1  [16])0x0;
  local_2c8._0_16_ = (undefined1  [16])0x0;
  stack0xfffffffffffffd28 = (undefined1  [16])0x0;
  local_2e8._0_16_ = (undefined1  [16])0x0;
  stack0xfffffffffffffd08 = (undefined1  [16])0x0;
  local_308._0_16_ = (undefined1  [16])0x0;
  stack0xfffffffffffffce8 = (undefined1  [16])0x0;
  local_328._0_16_ = (undefined1  [16])0x0;
  local_348._16_4_ = 0;
  local_348._20_8_ = 0;
  uStack_32c = 0;
  local_348.indirect_contents.indirect = (char *)0x0;
  local_348.indirect_contents.capacity = 0;
  local_348._12_4_ = 0;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_828,&local_199);
  b._M_extent._M_extent_value = CONCAT44(local_828._12_4_,local_828._8_4_) - local_828._0_8_;
  b._M_ptr = (pointer)local_828._0_8_;
  ppVar7 = &CScript::operator<<((CScript *)local_2c8,b)->super_CScriptBase;
  uVar2 = ppVar7->_size;
  uVar3 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar3 = uVar2;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar7->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar8 = ppVar7;
  }
  local_420[0] = (class_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar7,(uchar *)((long)&ppVar8->_union + (long)(int)uVar3),local_420);
  if ((_func_int **)local_828._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_828._0_8_,
                    CONCAT44(local_828._20_4_,local_828._16_4_) - local_828._0_8_);
  }
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_828,&local_1da);
  b_00._M_extent._M_extent_value = CONCAT44(local_828._12_4_,local_828._8_4_) - local_828._0_8_;
  b_00._M_ptr = (pointer)local_828._0_8_;
  ppVar7 = &CScript::operator<<((CScript *)local_2e8,b_00)->super_CScriptBase;
  uVar2 = ppVar7->_size;
  uVar3 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar3 = uVar2;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar7->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar8 = ppVar7;
  }
  local_420[0] = (class_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar7,(uchar *)((long)&ppVar8->_union + (long)(int)uVar3),local_420);
  if ((_func_int **)local_828._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_828._0_8_,
                    CONCAT44(local_828._20_4_,local_828._16_4_) - local_828._0_8_);
  }
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_828,&local_25c);
  b_01._M_extent._M_extent_value = CONCAT44(local_828._12_4_,local_828._8_4_) - local_828._0_8_;
  b_01._M_ptr = (pointer)local_828._0_8_;
  ppVar7 = &CScript::operator<<((CScript *)local_308,b_01)->super_CScriptBase;
  uVar2 = ppVar7->_size;
  uVar3 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar3 = uVar2;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar7->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar8 = ppVar7;
  }
  local_420[0] = (class_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar7,(uchar *)((long)&ppVar8->_union + (long)(int)uVar3),local_420);
  if ((_func_int **)local_828._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_828._0_8_,
                    CONCAT44(local_828._20_4_,local_828._16_4_) - local_828._0_8_);
  }
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_828,&local_29d);
  b_02._M_extent._M_extent_value = CONCAT44(local_828._12_4_,local_828._8_4_) - local_828._0_8_;
  b_02._M_ptr = (pointer)local_828._0_8_;
  ppVar7 = &CScript::operator<<((CScript *)local_328,b_02)->super_CScriptBase;
  uVar2 = ppVar7->_size;
  uVar3 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar3 = uVar2;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar7->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar8 = ppVar7;
  }
  local_420[0] = (class_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar7,(uchar *)((long)&ppVar8->_union + (long)(int)uVar3),local_420);
  if ((_func_int **)local_828._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_828._0_8_,
                    CONCAT44(local_828._20_4_,local_828._16_4_) - local_828._0_8_);
  }
  local_958.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_958.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_958.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (CPubKey *)0x0;
  std::vector<CPubKey,std::allocator<CPubKey>>::_M_realloc_insert<CPubKey_const&>
            ((vector<CPubKey,std::allocator<CPubKey>> *)&local_958,(iterator)0x0,&local_199);
  pCVar6 = local_958.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_958.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_958.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<CPubKey,std::allocator<CPubKey>>::_M_realloc_insert<CPubKey_const&>
              ((vector<CPubKey,std::allocator<CPubKey>> *)&local_958,
               (iterator)
               local_958.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_21b);
  }
  else {
    memcpy(local_958.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
           super__Vector_impl_data._M_finish,&local_21b,0x41);
    local_958.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
    _M_finish = pCVar6 + 1;
  }
  GetScriptForMultisig((CScript *)local_828,2,&local_958);
  pCVar5 = (CMutableTransaction *)local_828._24_8_;
  if (0x1c < uStack_32c) {
    free(local_348.indirect_contents.indirect);
    pCVar5 = (CMutableTransaction *)local_828._24_8_;
  }
  local_828._28_4_ = (undefined4)((ulong)pCVar5 >> 0x20);
  local_828._24_4_ = SUB84(pCVar5,0);
  local_348._20_8_ = CONCAT44(local_828._24_4_,local_828._20_4_);
  local_348._16_4_ = local_828._16_4_;
  local_348.indirect_contents.indirect = (char *)local_828._0_8_;
  local_348.indirect_contents.capacity = local_828._8_4_;
  uStack_32c = local_828._28_4_;
  local_968 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_960 = "";
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x276;
  file_03.m_begin = (iterator)&local_968;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  local_828._24_8_ = pCVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_978,
             msg_03);
  local_420[0] = FillableSigningProvider::AddCScript
                           ((FillableSigningProvider *)local_c8,(CScript *)local_2c8);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf204e4;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf20506;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_988 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_980 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_988,0x276);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_998 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_990 = "";
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x277;
  file_04.m_begin = (iterator)&local_998;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_9a8,
             msg_04);
  local_420[0] = FillableSigningProvider::AddCScript
                           ((FillableSigningProvider *)local_c8,(CScript *)local_2e8);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf20507;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf20529;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_9b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_9b0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_9b8,0x277);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_9c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_9c0 = "";
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x278;
  file_05.m_begin = (iterator)&local_9c8;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_9d8,
             msg_05);
  local_420[0] = FillableSigningProvider::AddCScript
                           ((FillableSigningProvider *)local_c8,(CScript *)local_308);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf2052a;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf2054d;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_9e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_9e0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_9e8,0x278);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_9f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_9f0 = "";
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x279;
  file_06.m_begin = (iterator)&local_9f8;
  msg_06.m_end = pvVar10;
  msg_06.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_a08,
             msg_06);
  local_420[0] = FillableSigningProvider::AddCScript
                           ((FillableSigningProvider *)local_c8,(CScript *)local_328);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf2054e;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf20571;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_a18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_a10 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_a18,0x279);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_a28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_a20 = "";
  local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x27a;
  file_07.m_begin = (iterator)&local_a28;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_a38,
             msg_07);
  local_420[0] = FillableSigningProvider::AddCScript
                           ((FillableSigningProvider *)local_c8,
                            (CScript *)&local_348.indirect_contents);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf20572;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf20592;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_a48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_a40 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_a48,0x27a);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_368._16_4_ = 0;
  local_368._20_8_ = 0;
  uStack_34c = 0;
  local_368.indirect_contents.indirect = (char *)0x0;
  local_368.indirect_contents.capacity = 0;
  local_368._12_4_ = 0;
  local_388._16_4_ = 0;
  local_388._20_8_ = 0;
  uStack_36c = 0;
  local_388.indirect_contents.indirect = (char *)0x0;
  local_388.indirect_contents.capacity = 0;
  local_388._12_4_ = 0;
  local_3a8._16_4_ = 0;
  local_3a8._20_8_ = 0;
  uStack_38c = 0;
  local_3a8.indirect_contents.indirect = (char *)0x0;
  local_3a8.indirect_contents.capacity = 0;
  local_3a8._12_4_ = 0;
  local_3c8._16_4_ = 0;
  local_3c8._20_8_ = 0;
  uStack_3ac = 0;
  local_3c8.indirect_contents.indirect = (char *)0x0;
  local_3c8.indirect_contents.capacity = 0;
  local_3c8._12_4_ = 0;
  local_3e8._16_4_ = 0;
  local_3e8._20_8_ = 0;
  uStack_3cc = 0;
  local_3e8.indirect_contents.indirect = (char *)0x0;
  local_3e8.indirect_contents.capacity = 0;
  local_3e8._12_4_ = 0;
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&local_458,&local_199);
  local_828._16_4_ =
       (size_type)
       local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_828._0_8_ =
       local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_828._8_4_ =
       SUB84(local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_828._12_4_ =
       (undefined4)
       ((ulong)local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x20);
  local_7e0[0].direct[0] = '\x05';
  GetScriptForDestination((CScript *)local_420,(CTxDestination *)local_828);
  if (0x1c < uStack_34c) {
    free(local_368.indirect_contents.indirect);
  }
  local_368.indirect_contents.indirect = (char *)CONCAT71(local_420._1_7_,local_420[0]);
  local_368._20_8_ =
       CONCAT44(vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_,local_420._20_4_);
  local_368._16_4_ = local_420._16_4_;
  local_368.indirect_contents.capacity = local_420._8_4_;
  local_368._12_4_ = local_420._12_4_;
  uStack_34c = vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
  vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&local_458,&local_1da);
  local_828._16_4_ =
       (size_type)
       local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_828._0_8_ =
       local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_828._8_4_ =
       SUB84(local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_828._12_4_ =
       (undefined4)
       ((ulong)local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x20);
  local_7e0[0].direct[0] = '\x05';
  GetScriptForDestination((CScript *)local_420,(CTxDestination *)local_828);
  if (0x1c < uStack_36c) {
    free(local_388.indirect_contents.indirect);
  }
  local_388.indirect_contents.indirect = (char *)CONCAT71(local_420._1_7_,local_420[0]);
  local_388._20_8_ =
       CONCAT44(vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_,local_420._20_4_);
  local_388._16_4_ = local_420._16_4_;
  local_388.indirect_contents.capacity = local_420._8_4_;
  local_388._12_4_ = local_420._12_4_;
  uStack_36c = vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
  vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&local_458,&local_25c);
  local_828._16_4_ =
       (size_type)
       local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_828._0_8_ =
       local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_828._8_4_ =
       SUB84(local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_828._12_4_ =
       (undefined4)
       ((ulong)local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x20);
  local_7e0[0].direct[0] = '\x05';
  GetScriptForDestination((CScript *)local_420,(CTxDestination *)local_828);
  if (0x1c < uStack_38c) {
    free(local_3a8.indirect_contents.indirect);
  }
  local_3a8.indirect_contents.indirect = (char *)CONCAT71(local_420._1_7_,local_420[0]);
  local_3a8._20_8_ =
       CONCAT44(vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_,local_420._20_4_);
  local_3a8._16_4_ = local_420._16_4_;
  local_3a8.indirect_contents.capacity = local_420._8_4_;
  local_3a8._12_4_ = local_420._12_4_;
  uStack_38c = vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
  vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&local_458,&local_29d);
  local_828._16_4_ =
       (size_type)
       local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_828._0_8_ =
       local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_828._8_4_ =
       SUB84(local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_828._12_4_ =
       (undefined4)
       ((ulong)local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x20);
  local_7e0[0].direct[0] = '\x05';
  GetScriptForDestination((CScript *)local_420,(CTxDestination *)local_828);
  if (0x1c < uStack_3ac) {
    free(local_3c8.indirect_contents.indirect);
  }
  local_3c8.indirect_contents.indirect = (char *)CONCAT71(local_420._1_7_,local_420[0]);
  local_3c8._20_8_ =
       CONCAT44(vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_,local_420._20_4_);
  local_3c8._16_4_ = local_420._16_4_;
  local_3c8.indirect_contents.capacity = local_420._8_4_;
  local_3c8._12_4_ = local_420._12_4_;
  uStack_3ac = vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
  vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  WitnessV0ScriptHash::WitnessV0ScriptHash
            ((WitnessV0ScriptHash *)&local_458,(CScript *)&local_348.indirect_contents);
  local_828._24_4_ =
       SUB84(local_458.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_828._28_4_ =
       (undefined4)
       ((ulong)local_458.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x20);
  local_828._0_8_ =
       local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_828._8_4_ =
       SUB84(local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_828._12_4_ =
       (undefined4)
       ((ulong)local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x20);
  local_7e0[0].direct[0] = '\x04';
  GetScriptForDestination((CScript *)local_420,(CTxDestination *)local_828);
  if (0x1c < uStack_3cc) {
    free(local_3e8.indirect_contents.indirect);
  }
  local_3e8.indirect_contents.indirect = (char *)CONCAT71(local_420._1_7_,local_420[0]);
  local_3e8._20_8_ =
       CONCAT44(vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_,local_420._20_4_);
  local_3e8._16_4_ = local_420._16_4_;
  local_3e8.indirect_contents.capacity = local_420._8_4_;
  local_3e8._12_4_ = local_420._12_4_;
  uStack_3cc = vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
  vStack_408.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  local_a58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_a50 = "";
  local_a68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x281;
  file_08.m_begin = (iterator)&local_a58;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_a68,
             msg_08);
  local_420[0] = FillableSigningProvider::AddCScript
                           ((FillableSigningProvider *)local_c8,
                            (CScript *)&local_368.indirect_contents);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf20593;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf205bc;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_a78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_a70 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_a78,0x281);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_a88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_a80 = "";
  local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x282;
  file_09.m_begin = (iterator)&local_a88;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_a98,
             msg_09);
  local_420[0] = FillableSigningProvider::AddCScript
                           ((FillableSigningProvider *)local_c8,
                            (CScript *)&local_388.indirect_contents);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf205bd;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf205e6;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_aa8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_aa0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_aa8,0x282);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_ab8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_ab0 = "";
  local_ac8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ac0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x283;
  file_10.m_begin = (iterator)&local_ab8;
  msg_10.m_end = pvVar10;
  msg_10.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_ac8,
             msg_10);
  local_420[0] = FillableSigningProvider::AddCScript
                           ((FillableSigningProvider *)local_c8,
                            (CScript *)&local_3a8.indirect_contents);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf205e7;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf20611;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_ad8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_ad0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_ad8,0x283);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_ae8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_ae0 = "";
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x284;
  file_11.m_begin = (iterator)&local_ae8;
  msg_11.m_end = pvVar10;
  msg_11.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_af8,
             msg_11);
  local_420[0] = FillableSigningProvider::AddCScript
                           ((FillableSigningProvider *)local_c8,
                            (CScript *)&local_3c8.indirect_contents);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf20612;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf2063c;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_b08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b00 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_b08,0x284);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_b18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b10 = "";
  local_b28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b20 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x285;
  file_12.m_begin = (iterator)&local_b18;
  msg_12.m_end = pvVar10;
  msg_12.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_b28,
             msg_12);
  local_420[0] = FillableSigningProvider::AddCScript
                           ((FillableSigningProvider *)local_c8,
                            (CScript *)&local_3e8.indirect_contents);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf2063d;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf2066a;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_b38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b30 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_b38,0x285);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_b48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b40 = "";
  local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b50 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x286;
  file_13.m_begin = (iterator)&local_b48;
  msg_13.m_end = pvVar10;
  msg_13.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_b58,
             msg_13);
  local_420[0] = FillableSigningProvider::AddCScript
                           ((FillableSigningProvider *)local_158,
                            (CScript *)&local_348.indirect_contents);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf2066b;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf2068c;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_b68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b60 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_b68,0x286);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_b78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b70 = "";
  local_b88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b80 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x287;
  file_14.m_begin = (iterator)&local_b78;
  msg_14.m_end = pvVar10;
  msg_14.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_b88,
             msg_14);
  local_420[0] = FillableSigningProvider::AddCScript
                           ((FillableSigningProvider *)local_158,
                            (CScript *)&local_3e8.indirect_contents);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf2068d;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf206bb;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_b98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_b90 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_b98,0x287);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_ba8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_ba0 = "";
  local_bb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bb0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x288;
  file_15.m_begin = (iterator)&local_ba8;
  msg_15.m_end = pvVar10;
  msg_15.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_bb8,
             msg_15);
  local_420[0] = FillableSigningProvider::AddKeyPubKey
                           ((FillableSigningProvider *)local_158,(CKey *)local_858,&local_21b);
  local_420._8_4_ = 0;
  local_420._12_4_ = 0;
  local_420._16_4_ = 0;
  local_420._20_4_ = 0;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf206bc;
  local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf206e1;
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_bc8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_bc0 = "";
  pvVar9 = (iterator)0x0;
  local_828._24_8_ = &local_458;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_420,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)&local_bc8,0x288);
  boost::detail::shared_count::~shared_count((shared_count *)(local_420 + 0x10));
  local_bd8._M_ptr = (element_type *)0x0;
  local_bd8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_be8._M_ptr = (element_type *)0x0;
  local_be8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_420);
  CMutableTransaction::CMutableTransaction(&local_458);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_2c8,(CTransactionRef *)&local_bd8,
             (CMutableTransaction *)local_420,true);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_2e8,(CTransactionRef *)&local_be8,
             &local_458,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,1,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x801,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x1fffdf,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,1,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0x801,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0x1fffdf,false);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,(CScript *)local_2c8);
  local_828._16_4_ = local_480;
  local_828._0_8_ = local_490;
  local_828._8_4_ = SUB84(pcStack_488,0);
  local_828._12_4_ = (undefined4)((ulong)pcStack_488 >> 0x20);
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_478,(CTransactionRef *)&local_bd8,
             (CMutableTransaction *)local_420,true);
  if (0x1c < local_45c) {
    free((void *)local_478._0_8_);
    local_478._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,(CScript *)local_2e8);
  local_828._16_4_ = local_480;
  local_828._0_8_ = local_490;
  local_828._8_4_ = SUB84(pcStack_488,0);
  local_828._12_4_ = (undefined4)((ulong)pcStack_488 >> 0x20);
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_478,(CTransactionRef *)&local_be8,
             &local_458,true);
  if (0x1c < local_45c) {
    free((void *)local_478._0_8_);
    local_478._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ReplaceRedeemScript(&(local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->scriptSig,(CScript *)local_2c8);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,1,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x801,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x1fffdf,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,1,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0x801,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0x1fffdf,false);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)&local_368.indirect_contents,
             (CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,true);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)&local_388.indirect_contents,
             (CTransactionRef *)&local_be8,&local_458,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,1,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x801,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x1fffdf,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,1,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0x801,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0x1fffdf,false);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,(CScript *)&local_368.indirect_contents);
  local_828._16_4_ = local_480;
  local_828._0_8_ = local_490;
  local_828._8_4_ = SUB84(pcStack_488,0);
  local_828._12_4_ = (undefined4)((ulong)pcStack_488 >> 0x20);
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_478,(CTransactionRef *)&local_bd8,
             (CMutableTransaction *)local_420,true);
  if (0x1c < local_45c) {
    free((void *)local_478._0_8_);
    local_478._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,(CScript *)&local_388.indirect_contents);
  local_828._16_4_ = local_480;
  local_828._0_8_ = local_490;
  local_828._8_4_ = SUB84(pcStack_488,0);
  local_828._12_4_ = (undefined4)((ulong)pcStack_488 >> 0x20);
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_478,(CTransactionRef *)&local_be8,
             &local_458,true);
  if (0x1c < local_45c) {
    free((void *)local_478._0_8_);
    local_478._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ReplaceRedeemScript(&(local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->scriptSig,
                      (CScript *)&local_368.indirect_contents);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,1,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x801,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x1fffdf,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,1,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0x801,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0x1fffdf,false);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_308,(CTransactionRef *)&local_bd8,
             (CMutableTransaction *)local_420,true);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_328,(CTransactionRef *)&local_be8,
             &local_458,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,1,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x801,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x1fffdf,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,1,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0x801,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0x1fffdf,false);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,(CScript *)local_308);
  local_828._16_4_ = local_480;
  local_828._0_8_ = local_490;
  local_828._8_4_ = SUB84(pcStack_488,0);
  local_828._12_4_ = (undefined4)((ulong)pcStack_488 >> 0x20);
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_478,(CTransactionRef *)&local_bd8,
             (CMutableTransaction *)local_420,true);
  if (0x1c < local_45c) {
    free((void *)local_478._0_8_);
    local_478._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,(CScript *)local_328);
  local_828._16_4_ = local_480;
  local_828._0_8_ = local_490;
  local_828._8_4_ = SUB84(pcStack_488,0);
  local_828._12_4_ = (undefined4)((ulong)pcStack_488 >> 0x20);
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_478,(CTransactionRef *)&local_be8,
             &local_458,true);
  if (0x1c < local_45c) {
    free((void *)local_478._0_8_);
    local_478._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ReplaceRedeemScript(&(local_458.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->scriptSig,(CScript *)local_308);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,1,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x801,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x1fffdf,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,1,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0x801,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,&local_458,0x1fffdf,false);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)&local_3a8.indirect_contents,
             (CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,false);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)&local_3c8.indirect_contents,
             (CTransactionRef *)&local_be8,&local_458,false);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,(CScript *)&local_3a8.indirect_contents);
  local_828._16_4_ = local_480;
  local_828._0_8_ = local_490;
  local_828._8_4_ = SUB84(pcStack_488,0);
  local_828._12_4_ = (undefined4)((ulong)pcStack_488 >> 0x20);
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_478,(CTransactionRef *)&local_bd8,
             (CMutableTransaction *)local_420,false);
  if (0x1c < local_45c) {
    free((void *)local_478._0_8_);
    local_478._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,(CScript *)&local_3c8.indirect_contents);
  local_828._16_4_ = local_480;
  local_828._0_8_ = local_490;
  local_828._8_4_ = SUB84(pcStack_488,0);
  local_828._12_4_ = (undefined4)((ulong)pcStack_488 >> 0x20);
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_478,(CTransactionRef *)&local_be8,
             &local_458,false);
  if (0x1c < local_45c) {
    free((void *)local_478._0_8_);
    local_478._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)&local_348.indirect_contents,
             (CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0,false);
  pvVar10 = (iterator)0x0;
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_158,(CScript *)&local_348.indirect_contents,
             (CTransactionRef *)&local_be8,&local_458,false);
  CheckWithFlag((CTransactionRef *)&local_be8,&local_458,0,false);
  local_c28._48_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_bf0 = "";
  local_c28._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_c28._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x2e5;
  file_16.m_begin = local_c28 + 0x30;
  msg_16.m_end = pvVar9;
  msg_16.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
             (size_t)(local_c28 + 0x20),msg_16);
  auVar1 = *(undefined1 (*) [16])
            (((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  auVar16[0] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
  auVar16[1] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
  auVar16[2] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
  auVar16[3] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
  auVar16[4] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
  auVar16[5] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
  auVar16[6] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
  auVar16[7] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
  auVar16[8] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
  auVar16[9] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
  auVar16[10] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
  auVar16[0xb] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                  );
  auVar16[0xc] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                  );
  auVar16[0xd] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                  );
  auVar16[0xe] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                  );
  auVar16[0xf] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                  );
  auVar12[0] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                auVar1[0]);
  auVar12[1] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                auVar1[1]);
  auVar12[2] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                auVar1[2]);
  auVar12[3] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                auVar1[3]);
  auVar12[4] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                auVar1[4]);
  auVar12[5] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                auVar1[5]);
  auVar12[6] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                auVar1[6]);
  auVar12[7] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                auVar1[7]);
  auVar12[8] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                auVar1[8]);
  auVar12[9] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                auVar1[9]);
  auVar12[10] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]
                 == auVar1[10]);
  auVar12[0xb] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]
                  == auVar1[0xb]);
  auVar12[0xc] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]
                  == auVar1[0xc]);
  auVar12[0xd] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]
                  == auVar1[0xd]);
  auVar12[0xe] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]
                  == auVar1[0xe]);
  auVar12[0xf] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]
                  == auVar1[0xf]);
  auVar12 = auVar12 & auVar16;
  local_478[0] = (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff;
  local_478._8_16_ = (undefined1  [16])0x0;
  local_490 = (_func_int **)0xf206e2;
  pcStack_488 = "";
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_c28._16_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_c28._24_8_ = "";
  _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  pvVar9 = (iterator)0x0;
  local_828._24_8_ = (ScriptHash *)&local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_478,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)(local_c28 + 0x10),0x2e5);
  boost::detail::shared_count::~shared_count((shared_count *)(local_478 + 0x10));
  pCVar4 = (CTxIn *)CONCAT71(local_420._1_7_,local_420[0]);
  local_c28._0_8_ = local_bd8._M_ptr;
  local_c28._8_8_ = local_bd8._M_refcount._M_pi;
  if (local_bd8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_bd8._M_refcount._M_pi)->_M_use_count = (local_bd8._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_bd8._M_refcount._M_pi)->_M_use_count = (local_bd8._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c28;
  CombineSignatures((SignatureData *)local_828,(CMutableTransaction *)local_420,&local_458,tx);
  UpdateInput(pCVar4,(SignatureData *)local_828);
  SignatureData::~SignatureData((SignatureData *)local_828);
  if ((pointer)local_c28._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c28._8_8_);
  }
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x1fffdf,true);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,(CScript *)&local_348.indirect_contents);
  local_828._16_4_ = local_480;
  local_828._0_8_ = local_490;
  local_828._8_4_ = SUB84(pcStack_488,0);
  local_828._12_4_ = (undefined4)((ulong)pcStack_488 >> 0x20);
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_478,(CTransactionRef *)&local_bd8,
             (CMutableTransaction *)local_420,false);
  if (0x1c < local_45c) {
    free((void *)local_478._0_8_);
    local_478._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,1,false);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,(CScript *)&local_348.indirect_contents);
  local_828._16_4_ = local_480;
  local_828._0_8_ = local_490;
  local_828._8_4_ = SUB84(pcStack_488,0);
  local_828._12_4_ = (undefined4)((ulong)pcStack_488 >> 0x20);
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  pvVar10 = (iterator)0x0;
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_158,(CScript *)local_478,(CTransactionRef *)&local_be8
             ,&local_458,false);
  if (0x1c < local_45c) {
    free((void *)local_478._0_8_);
    local_478._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  CheckWithFlag((CTransactionRef *)&local_be8,&local_458,0,true);
  CheckWithFlag((CTransactionRef *)&local_be8,&local_458,1,false);
  local_c68._48_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_c30 = "";
  local_c68._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_c68._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x2f0;
  file_17.m_begin = local_c68 + 0x30;
  msg_17.m_end = pvVar9;
  msg_17.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
             (size_t)(local_c68 + 0x20),msg_17);
  auVar1 = *(undefined1 (*) [16])
            (((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  auVar17[0] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
  auVar17[1] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
  auVar17[2] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
  auVar17[3] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
  auVar17[4] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
  auVar17[5] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
  auVar17[6] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
  auVar17[7] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
  auVar17[8] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
  auVar17[9] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
  auVar17[10] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
  auVar17[0xb] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                  );
  auVar17[0xc] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                  );
  auVar17[0xd] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                  );
  auVar17[0xe] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                  );
  auVar17[0xf] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                  );
  auVar13[0] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                auVar1[0]);
  auVar13[1] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                auVar1[1]);
  auVar13[2] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                auVar1[2]);
  auVar13[3] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                auVar1[3]);
  auVar13[4] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                auVar1[4]);
  auVar13[5] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                auVar1[5]);
  auVar13[6] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                auVar1[6]);
  auVar13[7] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                auVar1[7]);
  auVar13[8] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                auVar1[8]);
  auVar13[9] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                auVar1[9]);
  auVar13[10] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]
                 == auVar1[10]);
  auVar13[0xb] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]
                  == auVar1[0xb]);
  auVar13[0xc] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]
                  == auVar1[0xc]);
  auVar13[0xd] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]
                  == auVar1[0xd]);
  auVar13[0xe] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]
                  == auVar1[0xe]);
  auVar13[0xf] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]
                  == auVar1[0xf]);
  auVar13 = auVar13 & auVar17;
  local_478[0] = (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff;
  local_478._8_16_ = (undefined1  [16])0x0;
  local_490 = (_func_int **)0xf206e2;
  pcStack_488 = "";
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_c68._16_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_c68._24_8_ = "";
  _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  pvVar9 = (iterator)0x0;
  local_828._24_8_ = (ScriptHash *)&local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_478,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)(local_c68 + 0x10),0x2f0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_478 + 0x10));
  pCVar4 = (CTxIn *)CONCAT71(local_420._1_7_,local_420[0]);
  local_c68._0_8_ = local_bd8._M_ptr;
  local_c68._8_8_ = local_bd8._M_refcount._M_pi;
  if (local_bd8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_bd8._M_refcount._M_pi)->_M_use_count = (local_bd8._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_bd8._M_refcount._M_pi)->_M_use_count = (local_bd8._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c68;
  CombineSignatures((SignatureData *)local_828,(CMutableTransaction *)local_420,&local_458,tx_00);
  UpdateInput(pCVar4,(SignatureData *)local_828);
  SignatureData::~SignatureData((SignatureData *)local_828);
  if ((pointer)local_c68._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c68._8_8_);
  }
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,1,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x1fffdf,true);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)&local_3e8.indirect_contents,
             (CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,false);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x801,false);
  pvVar10 = (iterator)0x0;
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_158,(CScript *)&local_3e8.indirect_contents,
             (CTransactionRef *)&local_be8,&local_458,false);
  CheckWithFlag((CTransactionRef *)&local_be8,&local_458,0,true);
  CheckWithFlag((CTransactionRef *)&local_be8,&local_458,0x801,false);
  local_ca8._48_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_c70 = "";
  local_ca8._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_ca8._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x2fc;
  file_18.m_begin = local_ca8 + 0x30;
  msg_18.m_end = pvVar9;
  msg_18.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
             (size_t)(local_ca8 + 0x20),msg_18);
  auVar1 = *(undefined1 (*) [16])
            (((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  auVar18[0] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
  auVar18[1] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
  auVar18[2] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
  auVar18[3] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
  auVar18[4] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
  auVar18[5] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
  auVar18[6] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
  auVar18[7] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
  auVar18[8] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
  auVar18[9] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
  auVar18[10] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
  auVar18[0xb] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                  );
  auVar18[0xc] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                  );
  auVar18[0xd] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                  );
  auVar18[0xe] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                  );
  auVar18[0xf] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                  );
  auVar14[0] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                auVar1[0]);
  auVar14[1] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                auVar1[1]);
  auVar14[2] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                auVar1[2]);
  auVar14[3] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                auVar1[3]);
  auVar14[4] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                auVar1[4]);
  auVar14[5] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                auVar1[5]);
  auVar14[6] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                auVar1[6]);
  auVar14[7] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                auVar1[7]);
  auVar14[8] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                auVar1[8]);
  auVar14[9] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                auVar1[9]);
  auVar14[10] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]
                 == auVar1[10]);
  auVar14[0xb] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]
                  == auVar1[0xb]);
  auVar14[0xc] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]
                  == auVar1[0xc]);
  auVar14[0xd] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]
                  == auVar1[0xd]);
  auVar14[0xe] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]
                  == auVar1[0xe]);
  auVar14[0xf] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]
                  == auVar1[0xf]);
  auVar14 = auVar14 & auVar18;
  local_478[0] = (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff;
  local_478._8_16_ = (undefined1  [16])0x0;
  local_490 = (_func_int **)0xf206e2;
  pcStack_488 = "";
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_ca8._16_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_ca8._24_8_ = "";
  _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  pvVar9 = (iterator)0x0;
  local_828._24_8_ = (ScriptHash *)&local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_478,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)(local_ca8 + 0x10),0x2fc);
  boost::detail::shared_count::~shared_count((shared_count *)(local_478 + 0x10));
  pCVar4 = (CTxIn *)CONCAT71(local_420._1_7_,local_420[0]);
  local_ca8._0_8_ = local_bd8._M_ptr;
  local_ca8._8_8_ = local_bd8._M_refcount._M_pi;
  if (local_bd8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_bd8._M_refcount._M_pi)->_M_use_count = (local_bd8._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_bd8._M_refcount._M_pi)->_M_use_count = (local_bd8._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  tx_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  tx_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_ca8;
  CombineSignatures((SignatureData *)local_828,(CMutableTransaction *)local_420,&local_458,tx_01);
  UpdateInput(pCVar4,(SignatureData *)local_828);
  SignatureData::~SignatureData((SignatureData *)local_828);
  if ((pointer)local_ca8._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ca8._8_8_);
  }
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x801,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x1fffdf,true);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,(CScript *)&local_3e8.indirect_contents);
  local_828._16_4_ = local_480;
  local_828._0_8_ = local_490;
  local_828._8_4_ = SUB84(pcStack_488,0);
  local_828._12_4_ = (undefined4)((ulong)pcStack_488 >> 0x20);
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_c8,(CScript *)local_478,(CTransactionRef *)&local_bd8,
             (CMutableTransaction *)local_420,false);
  if (0x1c < local_45c) {
    free((void *)local_478._0_8_);
    local_478._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,1,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x801,false);
  ScriptHash::ScriptHash((ScriptHash *)&local_490,(CScript *)&local_3e8.indirect_contents);
  local_828._16_4_ = local_480;
  local_828._0_8_ = local_490;
  local_828._8_4_ = SUB84(pcStack_488,0);
  local_828._12_4_ = (undefined4)((ulong)pcStack_488 >> 0x20);
  local_7e0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)local_478,(CTxDestination *)local_828);
  pvVar10 = (iterator)0x0;
  CreateCreditAndSpend
            ((FillableSigningProvider *)local_158,(CScript *)local_478,(CTransactionRef *)&local_be8
             ,&local_458,false);
  if (0x1c < local_45c) {
    free((void *)local_478._0_8_);
    local_478._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_828);
  CheckWithFlag((CTransactionRef *)&local_be8,&local_458,1,true);
  CheckWithFlag((CTransactionRef *)&local_be8,&local_458,0x801,false);
  local_ce8._48_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_cb0 = "";
  local_ce8._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_ce8._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x308;
  file_19.m_begin = local_ce8 + 0x30;
  msg_19.m_end = pvVar9;
  msg_19.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
             (size_t)(local_ce8 + 0x20),msg_19);
  auVar1 = *(undefined1 (*) [16])
            (((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  auVar19[0] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
  auVar19[1] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
  auVar19[2] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
  auVar19[3] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
  auVar19[4] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
  auVar19[5] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
  auVar19[6] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
  auVar19[7] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
  auVar19[8] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
  auVar19[9] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
  auVar19[10] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
  auVar19[0xb] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                  );
  auVar19[0xc] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                  );
  auVar19[0xd] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                  );
  auVar19[0xe] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                  );
  auVar19[0xf] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                  == ((local_bd8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                  );
  auVar15[0] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                auVar1[0]);
  auVar15[1] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                auVar1[1]);
  auVar15[2] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                auVar1[2]);
  auVar15[3] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                auVar1[3]);
  auVar15[4] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                auVar1[4]);
  auVar15[5] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                auVar1[5]);
  auVar15[6] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                auVar1[6]);
  auVar15[7] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                auVar1[7]);
  auVar15[8] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                auVar1[8]);
  auVar15[9] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                auVar1[9]);
  auVar15[10] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]
                 == auVar1[10]);
  auVar15[0xb] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]
                  == auVar1[0xb]);
  auVar15[0xc] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]
                  == auVar1[0xc]);
  auVar15[0xd] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]
                  == auVar1[0xd]);
  auVar15[0xe] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]
                  == auVar1[0xe]);
  auVar15[0xf] = -(((local_be8._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]
                  == auVar1[0xf]);
  auVar15 = auVar15 & auVar19;
  local_478[0] = (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff;
  local_478._8_16_ = (undefined1  [16])0x0;
  local_490 = (_func_int **)0xf206e2;
  pcStack_488 = "";
  local_828._8_4_ = local_828._8_4_ & 0xffffff00;
  local_828._0_8_ = &PTR__lazy_ostream_01389048;
  local_828._16_4_ = 0x139d138;
  local_828._20_4_ = 0;
  local_ce8._16_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_ce8._24_8_ = "";
  _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_828._24_8_ = (ScriptHash *)&local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_478,(lazy_ostream *)local_828,1,0,WARN,(check_type)ppuVar20,
             (size_t)(local_ce8 + 0x10),0x308);
  boost::detail::shared_count::~shared_count((shared_count *)(local_478 + 0x10));
  pCVar4 = (CTxIn *)CONCAT71(local_420._1_7_,local_420[0]);
  local_ce8._0_8_ = local_bd8._M_ptr;
  local_ce8._8_8_ = local_bd8._M_refcount._M_pi;
  if (local_bd8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_bd8._M_refcount._M_pi)->_M_use_count = (local_bd8._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_bd8._M_refcount._M_pi)->_M_use_count = (local_bd8._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  tx_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  tx_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_ce8;
  CombineSignatures((SignatureData *)local_828,(CMutableTransaction *)local_420,&local_458,tx_02);
  UpdateInput(pCVar4,(SignatureData *)local_828);
  SignatureData::~SignatureData((SignatureData *)local_828);
  if ((pointer)local_ce8._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ce8._8_8_);
  }
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x801,true);
  CheckWithFlag((CTransactionRef *)&local_bd8,(CMutableTransaction *)local_420,0x1fffdf,true);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_458.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_458.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_408);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_420);
  if (local_be8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_be8._M_refcount._M_pi);
  }
  if (local_bd8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_bd8._M_refcount._M_pi);
  }
  if (0x1c < uStack_3cc) {
    free(local_3e8.indirect_contents.indirect);
  }
  if (0x1c < uStack_3ac) {
    free(local_3c8.indirect_contents.indirect);
  }
  if (0x1c < uStack_38c) {
    free(local_3a8.indirect_contents.indirect);
  }
  if (0x1c < uStack_36c) {
    free(local_388.indirect_contents.indirect);
  }
  if (0x1c < uStack_34c) {
    free(local_368.indirect_contents.indirect);
  }
  if (local_958.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_958.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_958.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_958.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (0x1c < uStack_32c) {
    free(local_348.indirect_contents.indirect);
  }
  if (0x1c < uStack_30c) {
    free((void *)local_328._0_8_);
  }
  if (0x1c < uStack_2ec) {
    free((void *)local_308._0_8_);
  }
  if (0x1c < uStack_2cc) {
    free((void *)local_2e8._0_8_);
  }
  if (0x1c < uStack_2ac) {
    free((void *)local_2c8._0_8_);
  }
  if ((_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_870._M_head_impl !=
      (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_870,
               local_870._M_head_impl);
  }
  if (local_860._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_860,
               (array<unsigned_char,_32UL> *)
               local_860._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  if (local_850._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_850,
               local_850._M_head_impl);
  }
  if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_840._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_840,
               (array<unsigned_char,_32UL> *)
               local_840._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_830._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_830,
               (array<unsigned_char,_32UL> *)
               local_830._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  local_158._0_8_ = ppuVar20;
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
               *)(local_158 + 0x38));
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
               *)(local_158 + 8));
  local_c8._0_8_ = ppuVar20;
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
               *)(local_c8 + 0x38));
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
               *)(local_c8 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_witness)
{
    FillableSigningProvider keystore, keystore2;
    CKey key1 = GenerateRandomKey();
    CKey key2 = GenerateRandomKey();
    CKey key3 = GenerateRandomKey();
    CKey key1L = GenerateRandomKey(/*compressed=*/false);
    CKey key2L = GenerateRandomKey(/*compressed=*/false);
    CPubKey pubkey1 = key1.GetPubKey();
    CPubKey pubkey2 = key2.GetPubKey();
    CPubKey pubkey3 = key3.GetPubKey();
    CPubKey pubkey1L = key1L.GetPubKey();
    CPubKey pubkey2L = key2L.GetPubKey();
    BOOST_CHECK(keystore.AddKeyPubKey(key1, pubkey1));
    BOOST_CHECK(keystore.AddKeyPubKey(key2, pubkey2));
    BOOST_CHECK(keystore.AddKeyPubKey(key1L, pubkey1L));
    BOOST_CHECK(keystore.AddKeyPubKey(key2L, pubkey2L));
    CScript scriptPubkey1, scriptPubkey2, scriptPubkey1L, scriptPubkey2L, scriptMulti;
    scriptPubkey1 << ToByteVector(pubkey1) << OP_CHECKSIG;
    scriptPubkey2 << ToByteVector(pubkey2) << OP_CHECKSIG;
    scriptPubkey1L << ToByteVector(pubkey1L) << OP_CHECKSIG;
    scriptPubkey2L << ToByteVector(pubkey2L) << OP_CHECKSIG;
    std::vector<CPubKey> oneandthree;
    oneandthree.push_back(pubkey1);
    oneandthree.push_back(pubkey3);
    scriptMulti = GetScriptForMultisig(2, oneandthree);
    BOOST_CHECK(keystore.AddCScript(scriptPubkey1));
    BOOST_CHECK(keystore.AddCScript(scriptPubkey2));
    BOOST_CHECK(keystore.AddCScript(scriptPubkey1L));
    BOOST_CHECK(keystore.AddCScript(scriptPubkey2L));
    BOOST_CHECK(keystore.AddCScript(scriptMulti));
    CScript destination_script_1, destination_script_2, destination_script_1L, destination_script_2L, destination_script_multi;
    destination_script_1 = GetScriptForDestination(WitnessV0KeyHash(pubkey1));
    destination_script_2 = GetScriptForDestination(WitnessV0KeyHash(pubkey2));
    destination_script_1L = GetScriptForDestination(WitnessV0KeyHash(pubkey1L));
    destination_script_2L = GetScriptForDestination(WitnessV0KeyHash(pubkey2L));
    destination_script_multi = GetScriptForDestination(WitnessV0ScriptHash(scriptMulti));
    BOOST_CHECK(keystore.AddCScript(destination_script_1));
    BOOST_CHECK(keystore.AddCScript(destination_script_2));
    BOOST_CHECK(keystore.AddCScript(destination_script_1L));
    BOOST_CHECK(keystore.AddCScript(destination_script_2L));
    BOOST_CHECK(keystore.AddCScript(destination_script_multi));
    BOOST_CHECK(keystore2.AddCScript(scriptMulti));
    BOOST_CHECK(keystore2.AddCScript(destination_script_multi));
    BOOST_CHECK(keystore2.AddKeyPubKey(key3, pubkey3));

    CTransactionRef output1, output2;
    CMutableTransaction input1, input2;

    // Normal pay-to-compressed-pubkey.
    CreateCreditAndSpend(keystore, scriptPubkey1, output1, input1);
    CreateCreditAndSpend(keystore, scriptPubkey2, output2, input2);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // P2SH pay-to-compressed-pubkey.
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptPubkey1)), output1, input1);
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptPubkey2)), output2, input2);
    ReplaceRedeemScript(input2.vin[0].scriptSig, scriptPubkey1);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // Witness pay-to-compressed-pubkey (v0).
    CreateCreditAndSpend(keystore, destination_script_1, output1, input1);
    CreateCreditAndSpend(keystore, destination_script_2, output2, input2);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // P2SH witness pay-to-compressed-pubkey (v0).
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_1)), output1, input1);
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_2)), output2, input2);
    ReplaceRedeemScript(input2.vin[0].scriptSig, destination_script_1);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // Normal pay-to-uncompressed-pubkey.
    CreateCreditAndSpend(keystore, scriptPubkey1L, output1, input1);
    CreateCreditAndSpend(keystore, scriptPubkey2L, output2, input2);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // P2SH pay-to-uncompressed-pubkey.
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptPubkey1L)), output1, input1);
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptPubkey2L)), output2, input2);
    ReplaceRedeemScript(input2.vin[0].scriptSig, scriptPubkey1L);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // Signing disabled for witness pay-to-uncompressed-pubkey (v1).
    CreateCreditAndSpend(keystore, destination_script_1L, output1, input1, false);
    CreateCreditAndSpend(keystore, destination_script_2L, output2, input2, false);

    // Signing disabled for P2SH witness pay-to-uncompressed-pubkey (v1).
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_1L)), output1, input1, false);
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_2L)), output2, input2, false);

    // Normal 2-of-2 multisig
    CreateCreditAndSpend(keystore, scriptMulti, output1, input1, false);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, false);
    CreateCreditAndSpend(keystore2, scriptMulti, output2, input2, false);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_NONE, false);
    BOOST_CHECK(*output1 == *output2);
    UpdateInput(input1.vin[0], CombineSignatures(input1, input2, output1));
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);

    // P2SH 2-of-2 multisig
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptMulti)), output1, input1, false);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, false);
    CreateCreditAndSpend(keystore2, GetScriptForDestination(ScriptHash(scriptMulti)), output2, input2, false);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_P2SH, false);
    BOOST_CHECK(*output1 == *output2);
    UpdateInput(input1.vin[0], CombineSignatures(input1, input2, output1));
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);

    // Witness 2-of-2 multisig
    CreateCreditAndSpend(keystore, destination_script_multi, output1, input1, false);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false);
    CreateCreditAndSpend(keystore2, destination_script_multi, output2, input2, false);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false);
    BOOST_CHECK(*output1 == *output2);
    UpdateInput(input1.vin[0], CombineSignatures(input1, input2, output1));
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);

    // P2SH witness 2-of-2 multisig
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_multi)), output1, input1, false);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false);
    CreateCreditAndSpend(keystore2, GetScriptForDestination(ScriptHash(destination_script_multi)), output2, input2, false);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false);
    BOOST_CHECK(*output1 == *output2);
    UpdateInput(input1.vin[0], CombineSignatures(input1, input2, output1));
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
}